

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O1

void __thiscall
Eigen::internal::
product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
::product_evaluator(product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    *this,XprType *xpr)

{
  long lVar1;
  double *__s;
  Matrix<double,__1,__1,_0,__1,__1> *rhs;
  ActualDstType actualDst;
  Scalar local_20;
  
  (this->super_evaluator<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>.m_d.data =
       (double *)0x0;
  lVar1 = (xpr->m_rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
          m_cols;
  (this->m_result).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->m_result).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols =
       0;
  if (lVar1 < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/PlainObjectBase.h"
                  ,0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, 1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 1, -1>]"
                 );
  }
  DenseStorage<double,_-1,_1,_-1,_1>::resize
            ((DenseStorage<double,__1,_1,__1,_1> *)&this->m_result,lVar1,1,lVar1);
  __s = (this->m_result).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
        m_data;
  lVar1 = (this->m_result).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
          m_cols;
  (this->super_evaluator<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>.m_d.data = __s;
  if (-1 < lVar1) {
    rhs = xpr->m_rhs;
    if (lVar1 != 0) {
      memset(__s,0,lVar1 << 3);
    }
    local_20 = 1.0;
    generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>>,Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::DenseShape,Eigen::DenseShape,7>
    ::scaleAndAddTo<Eigen::Matrix<double,1,_1,1,1,_1>>(&this->m_result,&xpr->m_lhs,rhs,&local_20);
    return;
  }
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CwiseNullaryOp.h"
                ,0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, 1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, 1, -1>]"
               );
}

Assistant:

void run(DstXprType &dst, const SrcXprType &src, const internal::assign_op<Scalar,Scalar> &)
  {
    Index dstRows = src.rows();
    Index dstCols = src.cols();
    if((dst.rows()!=dstRows) || (dst.cols()!=dstCols))
      dst.resize(dstRows, dstCols);
    // FIXME shall we handle nested_eval here?
    generic_product_impl<Lhs, Rhs>::evalTo(dst, src.lhs(), src.rhs());
  }